

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O0

int array_add_value(context_t *ctx,yajl_val array,yajl_val value)

{
  void *pvVar1;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  yajl_val *tmp;
  int local_4;
  
  pvVar1 = realloc(*(void **)(in_RSI + 8),(*(long *)(in_RSI + 0x10) + 1) * 8);
  if (pvVar1 == (void *)0x0) {
    if (*(long *)(in_RDI + 0x10) != 0) {
      snprintf(*(char **)(in_RDI + 0x10),*(size_t *)(in_RDI + 0x18),"Out of memory");
    }
    local_4 = 0xc;
  }
  else {
    *(void **)(in_RSI + 8) = pvVar1;
    *(undefined8 *)(*(long *)(in_RSI + 8) + *(long *)(in_RSI + 0x10) * 8) = in_RDX;
    *(long *)(in_RSI + 0x10) = *(long *)(in_RSI + 0x10) + 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int array_add_value (context_t *ctx,
                            yajl_val array, yajl_val value)
{
    yajl_val *tmp;

    /* We're checking for NULL pointers in "context_add_value" or its
     * callers. */
    assert (ctx != NULL);
    assert (array != NULL);
    assert (value != NULL);

    /* "context_add_value" will only call us with array values. */
    assert(YAJL_IS_ARRAY(array));

    tmp = realloc(array->u.array.values,
                  sizeof(*(array->u.array.values)) * (array->u.array.len + 1));
    if (tmp == NULL)
        RETURN_ERROR(ctx, ENOMEM, "Out of memory");
    array->u.array.values = tmp;
    array->u.array.values[array->u.array.len] = value;
    array->u.array.len++;

    return 0;
}